

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_bool32 ma_dr_flac__seek_to_pcm_frame__binary_search_internal
                    (ma_dr_flac *pFlac,ma_uint64 pcmFrameIndex,ma_uint64 byteRangeLo,
                    ma_uint64 byteRangeHi)

{
  ushort uVar1;
  ma_bool32 mVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  char cVar6;
  ma_uint64 mVar7;
  ma_uint64 mVar8;
  ma_uint64 mVar9;
  float fVar10;
  ma_uint64 lastSuccessfulSeekOffset;
  ma_uint64 local_58;
  ma_uint64 local_50;
  ma_uint64 local_48;
  ma_uint64 local_40;
  ulong local_38;
  
  mVar7 = pFlac->totalPCMFrameCount;
  local_50 = 0xffffffffffffffff;
  uVar1 = pFlac->maxBlockSizeInPCMFrames;
  local_38 = 0x1000;
  if (uVar1 != 0) {
    local_38 = (ulong)((uint)uVar1 + (uint)uVar1);
  }
  fVar10 = (float)(long)((ulong)pFlac->bitsPerSample * (ulong)pFlac->channels *
                        (pcmFrameIndex - pFlac->currentPCMFrame)) * 0.125 * 0.6;
  uVar3 = (ulong)fVar10;
  uVar3 = ((long)(fVar10 - 9.223372e+18) & (long)uVar3 >> 0x3f | uVar3) + byteRangeLo;
  local_58 = byteRangeHi;
  local_48 = byteRangeLo;
  local_40 = pcmFrameIndex;
  if (byteRangeHi <= uVar3) {
    uVar3 = byteRangeHi;
  }
  do {
    mVar2 = ma_dr_flac__seek_to_approximate_flac_frame_to_byte
                      (pFlac,uVar3,byteRangeLo,local_58,&local_50);
    if (mVar2 == 0) goto LAB_00191b81;
    mVar8 = (pFlac->currentFLACFrame).header.pcmFrameNumber;
    if (mVar8 == 0) {
      mVar8 = (ulong)pFlac->maxBlockSizeInPCMFrames *
              (ulong)(pFlac->currentFLACFrame).header.flacFrameNumber;
    }
    if (mVar7 == mVar8) {
      mVar2 = ma_dr_flac__seek_to_approximate_flac_frame_to_byte
                        (pFlac,local_48,local_48,local_58,&local_50);
      if (mVar2 == 0) {
        cVar6 = '\x02';
      }
      else {
        mVar9 = local_40 - pFlac->currentPCMFrame;
        mVar8 = ma_dr_flac__seek_forward_by_pcm_frames(pFlac,mVar9);
        cVar6 = (mVar8 != mVar9) + '\x01';
      }
    }
    else {
      lVar4 = (pFlac->currentFLACFrame).header.blockSizeInPCMFrames + mVar8;
      uVar5 = lVar4 - 1;
      if (lVar4 == 0) {
        uVar5 = 0;
      }
      mVar7 = mVar8;
      if ((local_40 < mVar8) || (uVar5 < local_40)) {
        lVar4 = (ulong)pFlac->bitsPerSample * (ulong)pFlac->channels;
        if (local_40 < mVar8) {
          if (local_50 <= byteRangeLo) {
            byteRangeLo = local_50;
          }
          uVar3 = (local_50 - byteRangeLo >> 1) + byteRangeLo;
          if (uVar3 <= byteRangeLo) {
            uVar3 = byteRangeLo;
          }
          cVar6 = '\0';
          local_58 = local_50;
        }
        else {
          if (local_40 - mVar8 < local_38) goto LAB_00191a5e;
          if (local_58 <= local_50) {
            local_58 = local_50;
          }
          fVar10 = (float)(long)(lVar4 * (local_40 - mVar8)) * 0.125 *
                   ((float)(long)(local_50 - pFlac->firstFLACFramePosInBytes) /
                   ((float)(long)(lVar4 * mVar8) * 0.125));
          uVar3 = (ulong)fVar10;
          uVar3 = ((long)(fVar10 - 9.223372e+18) & (long)uVar3 >> 0x3f | uVar3) + local_50;
          if (local_58 <= uVar3) {
            uVar3 = local_58;
          }
          if (local_48 <= local_50) {
            local_48 = local_50;
          }
          cVar6 = '\0';
          byteRangeLo = local_50;
        }
      }
      else {
LAB_00191a5e:
        mVar9 = local_40 - pFlac->currentPCMFrame;
        mVar8 = ma_dr_flac__seek_forward_by_pcm_frames(pFlac,mVar9);
        cVar6 = (mVar8 != mVar9) + '\x01';
      }
    }
  } while (cVar6 == '\0');
  if (cVar6 == '\x02') {
LAB_00191b81:
    ma_dr_flac__seek_to_byte(&pFlac->bs,pFlac->firstFLACFramePosInBytes);
    mVar2 = 0;
    memset(&pFlac->currentFLACFrame,0,0xa8);
  }
  else {
    mVar2 = 1;
  }
  return mVar2;
}

Assistant:

static ma_bool32 ma_dr_flac__seek_to_pcm_frame__binary_search_internal(ma_dr_flac* pFlac, ma_uint64 pcmFrameIndex, ma_uint64 byteRangeLo, ma_uint64 byteRangeHi)
{
    ma_uint64 targetByte;
    ma_uint64 pcmRangeLo = pFlac->totalPCMFrameCount;
    ma_uint64 pcmRangeHi = 0;
    ma_uint64 lastSuccessfulSeekOffset = (ma_uint64)-1;
    ma_uint64 closestSeekOffsetBeforeTargetPCMFrame = byteRangeLo;
    ma_uint32 seekForwardThreshold = (pFlac->maxBlockSizeInPCMFrames != 0) ? pFlac->maxBlockSizeInPCMFrames*2 : 4096;
    targetByte = byteRangeLo + (ma_uint64)(((ma_int64)((pcmFrameIndex - pFlac->currentPCMFrame) * pFlac->channels * pFlac->bitsPerSample)/8.0f) * MA_DR_FLAC_BINARY_SEARCH_APPROX_COMPRESSION_RATIO);
    if (targetByte > byteRangeHi) {
        targetByte = byteRangeHi;
    }
    for (;;) {
        if (ma_dr_flac__seek_to_approximate_flac_frame_to_byte(pFlac, targetByte, byteRangeLo, byteRangeHi, &lastSuccessfulSeekOffset)) {
            ma_uint64 newPCMRangeLo;
            ma_uint64 newPCMRangeHi;
            ma_dr_flac__get_pcm_frame_range_of_current_flac_frame(pFlac, &newPCMRangeLo, &newPCMRangeHi);
            if (pcmRangeLo == newPCMRangeLo) {
                if (!ma_dr_flac__seek_to_approximate_flac_frame_to_byte(pFlac, closestSeekOffsetBeforeTargetPCMFrame, closestSeekOffsetBeforeTargetPCMFrame, byteRangeHi, &lastSuccessfulSeekOffset)) {
                    break;
                }
                if (ma_dr_flac__decode_flac_frame_and_seek_forward_by_pcm_frames(pFlac, pcmFrameIndex - pFlac->currentPCMFrame)) {
                    return MA_TRUE;
                } else {
                    break;
                }
            }
            pcmRangeLo = newPCMRangeLo;
            pcmRangeHi = newPCMRangeHi;
            if (pcmRangeLo <= pcmFrameIndex && pcmRangeHi >= pcmFrameIndex) {
                if (ma_dr_flac__decode_flac_frame_and_seek_forward_by_pcm_frames(pFlac, pcmFrameIndex - pFlac->currentPCMFrame) ) {
                    return MA_TRUE;
                } else {
                    break;
                }
            } else {
                const float approxCompressionRatio = (ma_int64)(lastSuccessfulSeekOffset - pFlac->firstFLACFramePosInBytes) / ((ma_int64)(pcmRangeLo * pFlac->channels * pFlac->bitsPerSample)/8.0f);
                if (pcmRangeLo > pcmFrameIndex) {
                    byteRangeHi = lastSuccessfulSeekOffset;
                    if (byteRangeLo > byteRangeHi) {
                        byteRangeLo = byteRangeHi;
                    }
                    targetByte = byteRangeLo + ((byteRangeHi - byteRangeLo) / 2);
                    if (targetByte < byteRangeLo) {
                        targetByte = byteRangeLo;
                    }
                } else  {
                    if ((pcmFrameIndex - pcmRangeLo) < seekForwardThreshold) {
                        if (ma_dr_flac__decode_flac_frame_and_seek_forward_by_pcm_frames(pFlac, pcmFrameIndex - pFlac->currentPCMFrame)) {
                            return MA_TRUE;
                        } else {
                            break;
                        }
                    } else {
                        byteRangeLo = lastSuccessfulSeekOffset;
                        if (byteRangeHi < byteRangeLo) {
                            byteRangeHi = byteRangeLo;
                        }
                        targetByte = lastSuccessfulSeekOffset + (ma_uint64)(((ma_int64)((pcmFrameIndex-pcmRangeLo) * pFlac->channels * pFlac->bitsPerSample)/8.0f) * approxCompressionRatio);
                        if (targetByte > byteRangeHi) {
                            targetByte = byteRangeHi;
                        }
                        if (closestSeekOffsetBeforeTargetPCMFrame < lastSuccessfulSeekOffset) {
                            closestSeekOffsetBeforeTargetPCMFrame = lastSuccessfulSeekOffset;
                        }
                    }
                }
            }
        } else {
            break;
        }
    }
    ma_dr_flac__seek_to_first_frame(pFlac);
    return MA_FALSE;
}